

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall Lexer::Append(Lexer *this,Lexeme *stream,uint count)

{
  uint uVar1;
  
  uVar1 = (this->lexems).count;
  SmallArray<Lexeme,_32U>::resize(&this->lexems,uVar1 + count);
  memcpy((this->lexems).data + uVar1,stream,(ulong)count << 5);
  return;
}

Assistant:

void Lexer::Append(Lexeme* stream, unsigned count)
{
	unsigned oldSize = lexems.size();
	lexems.resize(lexems.size() + count);
	memcpy(&lexems.data[oldSize], stream, count * sizeof(Lexeme));
}